

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::anon_unknown_0::PointsTestGroup::init
          (PointsTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  PointCase *pPVar1;
  undefined1 local_218 [8];
  Vec4 depthTestPoints [9];
  Vec4 viewportTestPoints [23];
  float littleOverViewport;
  PointsTestGroup *this_local;
  
  viewportTestPoints[0x16].m_data[3] = 1.01;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthTestPoints[8].m_data + 2),0.0,0.0,0.0,1.0)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0].m_data + 2),0.1,0.1,0.1,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[1].m_data + 2),-0.1,0.1,-0.1,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[2].m_data + 2),-0.1,-0.1,0.1,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[3].m_data + 2),0.1,-0.1,-0.1,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[4].m_data + 2),2.0,2.0,2.0,3.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[5].m_data + 2),-2.0,-2.0,2.0,3.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[6].m_data + 2),0.5,-0.5,0.5,0.7);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[7].m_data + 2),-0.5,0.5,-0.5,0.7);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[8].m_data + 2),-2.0,-2.0,0.0,2.2);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[9].m_data + 2),1.0,-1.0,0.0,1.1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[10].m_data + 2),-1.0,1.0,0.0,1.1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0xb].m_data + 2),1.3,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0xc].m_data + 2),-1.3,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0xd].m_data + 2),0.0,1.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0xe].m_data + 2),0.0,-1.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0xf].m_data + 2),-1.3,-1.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0x10].m_data + 2),-1.3,1.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0x11].m_data + 2),1.3,1.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0x12].m_data + 2),1.3,-1.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0x13].m_data + 2),1.01,1.01,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0x14].m_data + 2),0.0,1.01,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportTestPoints[0x15].m_data + 2),1.01,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_218,0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthTestPoints[0].m_data + 2),0.1,0.1,0.1,1.0)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthTestPoints[1].m_data + 2),-0.1,0.1,-0.1,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthTestPoints[2].m_data + 2),-0.1,-0.1,0.1,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthTestPoints[3].m_data + 2),0.1,-0.1,-0.1,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthTestPoints[4].m_data + 2),0.1,0.0,1.1,1.0)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthTestPoints[5].m_data + 2),-0.1,0.0,-1.1,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthTestPoints[6].m_data + 2),-0.0,-0.1,1.1,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthTestPoints[7].m_data + 2),0.0,0.1,-1.1,1.0);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"point_z_clip","point z clipping",
             (Vector<float,_4> *)local_218,(Vec4 *)(depthTestPoints[8].m_data + 2),1.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"point_z_clip_viewport_center",
             "point z clipping",(Vec4 *)local_218,(Vec4 *)(depthTestPoints[8].m_data + 2),1.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"point_z_clip_viewport_corner",
             "point z clipping",(Vec4 *)local_218,(Vec4 *)(depthTestPoints[8].m_data + 2),1.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"point_clip_viewport_center",
             "point viewport clipping",(Vec4 *)(depthTestPoints[8].m_data + 2),
             (Vec4 *)(viewportTestPoints[0x16].m_data + 2),1.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"point_clip_viewport_corner",
             "point viewport clipping",(Vec4 *)(depthTestPoints[8].m_data + 2),
             (Vec4 *)(viewportTestPoints[0x16].m_data + 2),1.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_z_clip","point z clipping",
             (Vec4 *)local_218,(Vec4 *)(depthTestPoints[8].m_data + 2),5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_z_clip_viewport_center",
             "point z clipping",(Vec4 *)local_218,(Vec4 *)(depthTestPoints[8].m_data + 2),5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_z_clip_viewport_corner",
             "point z clipping",(Vec4 *)local_218,(Vec4 *)(depthTestPoints[8].m_data + 2),5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_clip",
             "point viewport clipping",(Vec4 *)(depthTestPoints[8].m_data + 2),
             (Vec4 *)(viewportTestPoints[0x16].m_data + 2),5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_clip_viewport_center",
             "point viewport clipping",(Vec4 *)(depthTestPoints[8].m_data + 2),
             (Vec4 *)(viewportTestPoints[0x16].m_data + 2),5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PointCase *)operator_new(0xa8);
  PointCase::PointCase
            (pPVar1,(this->super_TestCaseGroup).m_context,"wide_point_clip_viewport_corner",
             "point viewport clipping",(Vec4 *)(depthTestPoints[8].m_data + 2),
             (Vec4 *)(viewportTestPoints[0x16].m_data + 2),5.0,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  return extraout_EAX;
}

Assistant:

void PointsTestGroup::init (void)
{
	const float littleOverViewport = 1.0f + (2.0f / (TEST_CANVAS_SIZE)); // one pixel over the viewport edge in VIEWPORT_WHOLE, half pixels over in the reduced viewport.

	const tcu::Vec4 viewportTestPoints[] =
	{
		// in clip volume
		tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),
		tcu::Vec4( 0.1f,  0.1f,  0.1f,  1.0f),
		tcu::Vec4(-0.1f,  0.1f, -0.1f,  1.0f),
		tcu::Vec4(-0.1f, -0.1f,  0.1f,  1.0f),
		tcu::Vec4( 0.1f, -0.1f, -0.1f,  1.0f),

		// in clip volume with w != 1
		tcu::Vec4( 2.0f,  2.0f,  2.0f,  3.0f),
		tcu::Vec4(-2.0f, -2.0f,  2.0f,  3.0f),
		tcu::Vec4( 0.5f, -0.5f,  0.5f,  0.7f),
		tcu::Vec4(-0.5f,  0.5f, -0.5f,  0.7f),

		// near the edge
		tcu::Vec4(-2.0f, -2.0f,  0.0f,  2.2f),
		tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.1f),
		tcu::Vec4(-1.0f,  1.0f,  0.0f,  1.1f),

		// not in the volume but still between near and far planes
		tcu::Vec4( 1.3f,  0.0f,  0.0f,  1.0f),
		tcu::Vec4(-1.3f,  0.0f,  0.0f,  1.0f),
		tcu::Vec4( 0.0f,  1.3f,  0.0f,  1.0f),
		tcu::Vec4( 0.0f, -1.3f,  0.0f,  1.0f),

		tcu::Vec4(-1.3f, -1.3f,  0.0f,  1.0f),
		tcu::Vec4(-1.3f,  1.3f,  0.0f,  1.0f),
		tcu::Vec4( 1.3f,  1.3f,  0.0f,  1.0f),
		tcu::Vec4( 1.3f, -1.3f,  0.0f,  1.0f),

		// outside the viewport, wide points have fragments in the viewport
		tcu::Vec4( littleOverViewport,  littleOverViewport,  0.0f,  1.0f),
		tcu::Vec4(               0.0f,  littleOverViewport,  0.0f,  1.0f),
		tcu::Vec4( littleOverViewport,                0.0f,  0.0f,  1.0f),
	};
	const tcu::Vec4 depthTestPoints[] =
	{
		// in clip volume
		tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),
		tcu::Vec4( 0.1f,  0.1f,  0.1f,  1.0f),
		tcu::Vec4(-0.1f,  0.1f, -0.1f,  1.0f),
		tcu::Vec4(-0.1f, -0.1f,  0.1f,  1.0f),
		tcu::Vec4( 0.1f, -0.1f, -0.1f,  1.0f),

		// not between the near and the far planes. These should be clipped
		tcu::Vec4( 0.1f,  0.0f,  1.1f,  1.0f),
		tcu::Vec4(-0.1f,  0.0f, -1.1f,  1.0f),
		tcu::Vec4(-0.0f, -0.1f,  1.1f,  1.0f),
		tcu::Vec4( 0.0f,  0.1f, -1.1f,  1.0f)
	};

	addChild(new PointCase(m_context, "point_z_clip",						"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		1.0f,	VIEWPORT_WHOLE));
	addChild(new PointCase(m_context, "point_z_clip_viewport_center",		"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		1.0f,	VIEWPORT_CENTER));
	addChild(new PointCase(m_context, "point_z_clip_viewport_corner",		"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		1.0f,	VIEWPORT_CORNER));

	addChild(new PointCase(m_context, "point_clip_viewport_center",			"point viewport clipping",		DE_ARRAY_BEGIN(viewportTestPoints), DE_ARRAY_END(viewportTestPoints),	1.0f,	VIEWPORT_CENTER));
	addChild(new PointCase(m_context, "point_clip_viewport_corner",			"point viewport clipping",		DE_ARRAY_BEGIN(viewportTestPoints), DE_ARRAY_END(viewportTestPoints),	1.0f,	VIEWPORT_CORNER));

	addChild(new PointCase(m_context, "wide_point_z_clip",					"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		5.0f,	VIEWPORT_WHOLE));
	addChild(new PointCase(m_context, "wide_point_z_clip_viewport_center",	"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		5.0f,	VIEWPORT_CENTER));
	addChild(new PointCase(m_context, "wide_point_z_clip_viewport_corner",	"point z clipping",				DE_ARRAY_BEGIN(depthTestPoints),	DE_ARRAY_END(depthTestPoints),		5.0f,	VIEWPORT_CORNER));

	addChild(new PointCase(m_context, "wide_point_clip",					"point viewport clipping",		DE_ARRAY_BEGIN(viewportTestPoints), DE_ARRAY_END(viewportTestPoints),	5.0f,	VIEWPORT_WHOLE));
	addChild(new PointCase(m_context, "wide_point_clip_viewport_center",	"point viewport clipping",		DE_ARRAY_BEGIN(viewportTestPoints), DE_ARRAY_END(viewportTestPoints),	5.0f,	VIEWPORT_CENTER));
	addChild(new PointCase(m_context, "wide_point_clip_viewport_corner",	"point viewport clipping",		DE_ARRAY_BEGIN(viewportTestPoints), DE_ARRAY_END(viewportTestPoints),	5.0f,	VIEWPORT_CORNER));
}